

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

int __thiscall BpTree<int>::IsFew(BpTree<int> *this,IndexNode<int> *Node)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  IndexNode<int> local_80;
  
  IndexNode<int>::IndexNode(&local_80,Node);
  IndexNode<int>::~IndexNode(&local_80);
  uVar2 = this->N;
  if (local_80.NodeState == '1') {
    uVar2 = uVar2 - 1;
    uVar1 = 0;
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)uVar2;
    }
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      if ((Node->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar1] != '1') goto LAB_0013185f;
    }
  }
  else {
    uVar1 = 0;
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)uVar2;
    }
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      if ((Node->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar1].FileOff == -1) goto LAB_0013185f;
    }
  }
LAB_00131861:
  return (uint)((int)uVar3 < (int)((uint)(((int)uVar2 / 2) * 2 < (int)uVar2) + (int)uVar2 / 2));
LAB_0013185f:
  uVar3 = uVar1 & 0xffffffff;
  goto LAB_00131861;
}

Assistant:

int BpTree<K>::IsFew(IndexNode<K> Node) {
	int i;
	if (this->IsLeaf(Node)) {
		for (i = 0; i < N - 1 && Node.v[i] == '1'; i++);
		return i < MIN_KEY_LEAF;
	}
	else {
		for (i = 0; i < N && Node.p[i].FileOff != -1; i++);
		return i < MIN_POINTS_NONLEAF;
	}
}